

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O3

void start_pass_fdctmgr(j_compress_ptr cinfo)

{
  forward_DCT_ptr p_Var1;
  double dVar2;
  int iVar3;
  J_DCT_METHOD JVar4;
  uint uVar5;
  jpeg_forward_dct *pjVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  uint6 uVar11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [14];
  code *pcVar17;
  forward_DCT_ptr p_Var18;
  jpeg_error_mgr *pjVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  jpeg_component_info *pjVar28;
  JQUANT_TBL *pJVar29;
  ushort uVar31;
  undefined1 auVar30 [16];
  ulong uVar32;
  uint uVar40;
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar41;
  int local_44;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined2 uVar39;
  
  if (0 < cinfo->num_components) {
    pjVar28 = cinfo->comp_info;
    pjVar6 = cinfo->fdct;
    lVar27 = 0;
    local_44 = 0;
    do {
      iVar3 = pjVar28->DCT_h_scaled_size;
      iVar20 = iVar3 * 0x100 + pjVar28->DCT_v_scaled_size;
      if (iVar20 < 0x70e) {
        if (iVar20 < 0x404) {
          if (iVar20 < 0x204) {
            if (iVar20 < 0x201) {
              if (iVar20 == 0x101) {
                pcVar17 = jpeg_fdct_1x1;
              }
              else {
                if (iVar20 != 0x102) {
LAB_001e0d67:
                  pjVar19 = cinfo->err;
                  pjVar19->msg_code = 7;
                  (pjVar19->msg_parm).i[0] = iVar3;
                  (cinfo->err->msg_parm).i[1] = pjVar28->DCT_v_scaled_size;
                  pjVar19 = cinfo->err;
LAB_001e0dbc:
                  (*pjVar19->error_exit)((j_common_ptr)cinfo);
                  goto LAB_001e0ac3;
                }
                pcVar17 = jpeg_fdct_1x2;
              }
            }
            else if (iVar20 == 0x201) {
              pcVar17 = jpeg_fdct_2x1;
            }
            else {
              if (iVar20 != 0x202) goto LAB_001e0d67;
              pcVar17 = jpeg_fdct_2x2;
            }
          }
          else if (iVar20 < 0x306) {
            if (iVar20 == 0x204) {
              pcVar17 = jpeg_fdct_2x4;
            }
            else {
              if (iVar20 != 0x303) goto LAB_001e0d67;
              pcVar17 = jpeg_fdct_3x3;
            }
          }
          else if (iVar20 == 0x306) {
            pcVar17 = jpeg_fdct_3x6;
          }
          else {
            if (iVar20 != 0x402) goto LAB_001e0d67;
            pcVar17 = jpeg_fdct_4x2;
          }
        }
        else if (iVar20 < 0x603) {
          if (iVar20 < 0x505) {
            if (iVar20 == 0x404) {
              pcVar17 = jpeg_fdct_4x4;
            }
            else {
              if (iVar20 != 0x408) goto LAB_001e0d67;
              pcVar17 = jpeg_fdct_4x8;
            }
          }
          else if (iVar20 == 0x505) {
            pcVar17 = jpeg_fdct_5x5;
          }
          else {
            if (iVar20 != 0x50a) goto LAB_001e0d67;
            pcVar17 = jpeg_fdct_5x10;
          }
        }
        else if (iVar20 < 0x60c) {
          if (iVar20 == 0x603) {
            pcVar17 = jpeg_fdct_6x3;
          }
          else {
            if (iVar20 != 0x606) goto LAB_001e0d67;
            pcVar17 = jpeg_fdct_6x6;
          }
        }
        else if (iVar20 == 0x60c) {
          pcVar17 = jpeg_fdct_6x12;
        }
        else {
          if (iVar20 != 0x707) goto LAB_001e0d67;
          pcVar17 = jpeg_fdct_7x7;
        }
LAB_001e0abc:
        pjVar6[1].forward_DCT[lVar27 + -1] = pcVar17;
        local_44 = 0;
      }
      else {
        if (0xc05 < iVar20) {
          if (iVar20 < 0xe0e) {
            if (iVar20 < 0xd0d) {
              if (iVar20 == 0xc06) {
                pcVar17 = jpeg_fdct_12x6;
              }
              else {
                if (iVar20 != 0xc0c) goto LAB_001e0d67;
                pcVar17 = jpeg_fdct_12x12;
              }
            }
            else if (iVar20 == 0xd0d) {
              pcVar17 = jpeg_fdct_13x13;
            }
            else {
              if (iVar20 != 0xe07) goto LAB_001e0d67;
              pcVar17 = jpeg_fdct_14x7;
            }
          }
          else if (iVar20 < 0x1008) {
            if (iVar20 == 0xe0e) {
              pcVar17 = jpeg_fdct_14x14;
            }
            else {
              if (iVar20 != 0xf0f) goto LAB_001e0d67;
              pcVar17 = jpeg_fdct_15x15;
            }
          }
          else if (iVar20 == 0x1008) {
            pcVar17 = jpeg_fdct_16x8;
          }
          else {
            if (iVar20 != 0x1010) goto LAB_001e0d67;
            pcVar17 = jpeg_fdct_16x16;
          }
          goto LAB_001e0abc;
        }
        if (0x908 < iVar20) {
          if (iVar20 < 0xa0a) {
            if (iVar20 == 0x909) {
              pcVar17 = jpeg_fdct_9x9;
            }
            else {
              if (iVar20 != 0xa05) goto LAB_001e0d67;
              pcVar17 = jpeg_fdct_10x5;
            }
          }
          else if (iVar20 == 0xa0a) {
            pcVar17 = jpeg_fdct_10x10;
          }
          else {
            if (iVar20 != 0xb0b) goto LAB_001e0d67;
            pcVar17 = jpeg_fdct_11x11;
          }
          goto LAB_001e0abc;
        }
        if (iVar20 < 0x808) {
          if (iVar20 == 0x70e) {
            pcVar17 = jpeg_fdct_7x14;
          }
          else {
            if (iVar20 != 0x804) goto LAB_001e0d67;
            pcVar17 = jpeg_fdct_8x4;
          }
          goto LAB_001e0abc;
        }
        if (iVar20 != 0x808) {
          if (iVar20 != 0x810) goto LAB_001e0d67;
          pcVar17 = jpeg_fdct_8x16;
          goto LAB_001e0abc;
        }
        JVar4 = cinfo->dct_method;
        if (JVar4 == JDCT_FLOAT) {
          pjVar6[2].forward_DCT[lVar27 + 2] = jpeg_fdct_float;
          local_44 = 2;
        }
        else {
          if (JVar4 != JDCT_IFAST) {
            if (JVar4 == JDCT_ISLOW) {
              pcVar17 = jpeg_fdct_islow;
              goto LAB_001e0abc;
            }
            pjVar19 = cinfo->err;
            pjVar19->msg_code = 0x31;
            goto LAB_001e0dbc;
          }
          pjVar6[1].forward_DCT[lVar27 + -1] = jpeg_fdct_ifast;
          local_44 = 1;
        }
      }
LAB_001e0ac3:
      uVar5 = pjVar28->quant_tbl_no;
      uVar23 = (ulong)uVar5;
      if ((3 < uVar23) || (pJVar29 = cinfo->quant_tbl_ptrs[uVar23], pJVar29 == (JQUANT_TBL *)0x0)) {
        uVar23 = (ulong)(int)uVar5;
        pjVar19 = cinfo->err;
        pjVar19->msg_code = 0x36;
        (pjVar19->msg_parm).i[0] = uVar5;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        pJVar29 = cinfo->quant_tbl_ptrs[uVar23];
      }
      if (local_44 == 2) {
        p_Var18 = pjVar6[3].forward_DCT[uVar23 + 1];
        if (p_Var18 == (forward_DCT_ptr)0x0) {
          p_Var18 = (forward_DCT_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          pjVar6[3].forward_DCT[uVar23 + 1] = p_Var18;
        }
        lVar22 = 0;
        lVar21 = 0;
        do {
          lVar24 = (long)(int)lVar21;
          lVar21 = lVar24 + 8;
          dVar2 = start_pass_fdctmgr::aanscalefactor[lVar22];
          pdVar25 = start_pass_fdctmgr::aanscalefactor;
          lVar26 = 0;
          do {
            auVar38._0_8_ =
                 (double)(*(uint *)(pJVar29->quantval + lVar24 + lVar26) & 0xffff) * dVar2 *
                 *pdVar25 * 8.0;
            auVar38._8_8_ =
                 (double)(*(uint *)(pJVar29->quantval + lVar24 + lVar26) >> 0x10) * dVar2 *
                 pdVar25[1] * 8.0;
            auVar37._8_8_ = 0x3ff0000000000000;
            auVar37._0_8_ = 0x3ff0000000000000;
            auVar38 = divpd(auVar37,auVar38);
            *(ulong *)(p_Var18 + lVar26 * 4 + lVar24 * 4) =
                 CONCAT44((float)auVar38._8_8_,(float)auVar38._0_8_);
            lVar26 = lVar26 + 2;
            pdVar25 = pdVar25 + 2;
          } while (lVar26 != 8);
          lVar22 = lVar22 + 1;
        } while (lVar22 != 8);
        pcVar17 = forward_DCT_float;
      }
      else {
        if (local_44 == 1) {
          p_Var18 = pjVar6[1].forward_DCT[uVar23 + 9];
          if (p_Var18 == (forward_DCT_ptr)0x0) {
            p_Var18 = (forward_DCT_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
            pjVar6[1].forward_DCT[uVar23 + 9] = p_Var18;
          }
          lVar21 = 0;
          do {
            uVar23 = *(ulong *)((long)pJVar29->quantval + lVar21);
            auVar7._8_4_ = 0;
            auVar7._0_8_ = uVar23;
            auVar7._12_2_ = (short)(uVar23 >> 0x30);
            auVar9._8_2_ = (short)(uVar23 >> 0x20);
            auVar9._0_8_ = uVar23;
            auVar9._10_4_ = auVar7._10_4_;
            uVar11 = auVar9._8_6_;
            auVar13._6_8_ = 0;
            auVar13._0_6_ = uVar11;
            Var14 = CONCAT82(SUB148(auVar13 << 0x40,6),(short)(uVar23 >> 0x10));
            auVar12._2_2_ = 0;
            auVar12._0_2_ = (ushort)uVar23;
            auVar12._4_10_ = Var14;
            uVar32 = (ulong)(uint)Var14;
            uVar5 = auVar7._10_4_ >> 0x10;
            uVar23 = *(ulong *)((long)start_pass_fdctmgr::aanscales + lVar21);
            uVar39 = (undefined2)(uVar23 >> 0x30);
            auVar35._8_4_ = 0;
            auVar35._0_8_ = uVar23;
            auVar35._12_2_ = uVar39;
            auVar35._14_2_ = uVar39;
            uVar39 = (undefined2)(uVar23 >> 0x20);
            auVar34._12_4_ = auVar35._12_4_;
            auVar34._8_2_ = 0;
            auVar34._0_8_ = uVar23;
            auVar34._10_2_ = uVar39;
            auVar33._10_6_ = auVar34._10_6_;
            auVar33._8_2_ = uVar39;
            auVar33._0_8_ = uVar23;
            uVar39 = (undefined2)(uVar23 >> 0x10);
            auVar15._4_8_ = auVar33._8_8_;
            auVar15._2_2_ = uVar39;
            auVar15._0_2_ = uVar39;
            auVar36._4_4_ = auVar15._0_4_ >> 0x10;
            uVar40 = auVar33._8_4_ >> 0x10;
            auVar36._12_4_ = auVar34._12_4_ >> 0x10;
            uVar41 = -(uint)((short)uVar23 < 0);
            auVar36._0_4_ = uVar40;
            auVar36._8_4_ = auVar36._12_4_;
            auVar30._4_4_ = -(uint)((int)auVar36._4_4_ < 0);
            auVar30._0_4_ = uVar41;
            auVar30._8_4_ = -(uint)((int)auVar36._4_4_ < 0);
            auVar30._12_4_ = -(uint)(auVar36._12_4_ < 0);
            p_Var1 = p_Var18 + lVar21 * 2;
            *(int *)p_Var1 =
                 (int)((ulong)(uint)(int)(short)uVar23 * (auVar12._0_8_ & 0xffffffff) + 0x400 +
                       ((ulong)uVar41 * (auVar12._0_8_ & 0xffffffff) << 0x20) >> 0xb);
            *(int *)(p_Var1 + 4) =
                 (int)(auVar36._4_4_ * uVar32 + 0x400 +
                       ((auVar30._8_8_ & 0xffffffff) * uVar32 << 0x20) >> 0xb);
            *(int *)(p_Var1 + 8) =
                 (int)((ulong)uVar40 * ((ulong)uVar11 & 0xffffffff) + 0x400 +
                       ((ulong)-(uint)((int)uVar40 < 0) * ((ulong)uVar11 & 0xffffffff) << 0x20) >>
                      0xb);
            *(int *)(p_Var1 + 0xc) =
                 (int)((auVar36._8_8_ & 0xffffffff) * (ulong)uVar5 + 0x400 +
                       ((ulong)-(uint)(auVar36._12_4_ < 0) * (ulong)uVar5 << 0x20) >> 0xb);
            lVar21 = lVar21 + 8;
          } while (lVar21 != 0x80);
        }
        else {
          p_Var18 = pjVar6[1].forward_DCT[uVar23 + 9];
          if (p_Var18 == (forward_DCT_ptr)0x0) {
            p_Var18 = (forward_DCT_ptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
            pjVar6[1].forward_DCT[uVar23 + 9] = p_Var18;
          }
          lVar21 = 0;
          do {
            uVar23 = *(ulong *)(pJVar29->quantval + lVar21);
            uVar31 = (ushort)(uVar23 >> 0x30);
            auVar8._8_4_ = 0;
            auVar8._0_8_ = uVar23;
            auVar8._12_2_ = uVar31;
            auVar10._8_2_ = (short)(uVar23 >> 0x20);
            auVar10._0_8_ = uVar23;
            auVar10._10_4_ = auVar8._10_4_;
            auVar16._6_8_ = 0;
            auVar16._0_6_ = auVar10._8_6_;
            p_Var1 = p_Var18 + lVar21 * 4;
            *(uint *)p_Var1 = (uint)(ushort)uVar23 << 3;
            *(int *)(p_Var1 + 4) =
                 (int)CONCAT82(SUB148(auVar16 << 0x40,6),(short)(uVar23 >> 0x10)) << 3;
            *(int *)(p_Var1 + 8) = auVar10._8_4_ << 3;
            *(uint *)(p_Var1 + 0xc) = (uint)uVar31 << 3;
            lVar21 = lVar21 + 4;
          } while (lVar21 != 0x40);
        }
        pcVar17 = forward_DCT;
      }
      pjVar6->forward_DCT[lVar27] = pcVar17;
      lVar27 = lVar27 + 1;
      pjVar28 = pjVar28 + 1;
    } while (lVar27 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass_fdctmgr (j_compress_ptr cinfo)
{
  my_fdct_ptr fdct = (my_fdct_ptr) cinfo->fdct;
  int ci, qtblno, i;
  jpeg_component_info *compptr;
  int method = 0;
  JQUANT_TBL * qtbl;
  DCTELEM * dtbl;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Select the proper DCT routine for this component's scaling */
    switch ((compptr->DCT_h_scaled_size << 8) + compptr->DCT_v_scaled_size) {
#ifdef DCT_SCALING_SUPPORTED
    case ((1 << 8) + 1):
      fdct->do_dct[ci] = jpeg_fdct_1x1;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_2x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((3 << 8) + 3):
      fdct->do_dct[ci] = jpeg_fdct_3x3;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_4x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((5 << 8) + 5):
      fdct->do_dct[ci] = jpeg_fdct_5x5;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_6x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((7 << 8) + 7):
      fdct->do_dct[ci] = jpeg_fdct_7x7;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((9 << 8) + 9):
      fdct->do_dct[ci] = jpeg_fdct_9x9;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((10 << 8) + 10):
      fdct->do_dct[ci] = jpeg_fdct_10x10;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((11 << 8) + 11):
      fdct->do_dct[ci] = jpeg_fdct_11x11;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((12 << 8) + 12):
      fdct->do_dct[ci] = jpeg_fdct_12x12;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((13 << 8) + 13):
      fdct->do_dct[ci] = jpeg_fdct_13x13;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((14 << 8) + 14):
      fdct->do_dct[ci] = jpeg_fdct_14x14;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((15 << 8) + 15):
      fdct->do_dct[ci] = jpeg_fdct_15x15;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((16 << 8) + 16):
      fdct->do_dct[ci] = jpeg_fdct_16x16;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((16 << 8) + 8):
      fdct->do_dct[ci] = jpeg_fdct_16x8;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((14 << 8) + 7):
      fdct->do_dct[ci] = jpeg_fdct_14x7;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((12 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_12x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((10 << 8) + 5):
      fdct->do_dct[ci] = jpeg_fdct_10x5;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((8 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_8x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 3):
      fdct->do_dct[ci] = jpeg_fdct_6x3;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_4x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 1):
      fdct->do_dct[ci] = jpeg_fdct_2x1;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((8 << 8) + 16):
      fdct->do_dct[ci] = jpeg_fdct_8x16;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((7 << 8) + 14):
      fdct->do_dct[ci] = jpeg_fdct_7x14;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((6 << 8) + 12):
      fdct->do_dct[ci] = jpeg_fdct_6x12;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((5 << 8) + 10):
      fdct->do_dct[ci] = jpeg_fdct_5x10;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((4 << 8) + 8):
      fdct->do_dct[ci] = jpeg_fdct_4x8;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((3 << 8) + 6):
      fdct->do_dct[ci] = jpeg_fdct_3x6;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((2 << 8) + 4):
      fdct->do_dct[ci] = jpeg_fdct_2x4;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
    case ((1 << 8) + 2):
      fdct->do_dct[ci] = jpeg_fdct_1x2;
      method = JDCT_ISLOW;	/* jfdctint uses islow-style table */
      break;
#endif
    case ((DCTSIZE << 8) + DCTSIZE):
      switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
      case JDCT_ISLOW:
	fdct->do_dct[ci] = jpeg_fdct_islow;
	method = JDCT_ISLOW;
	break;
#endif
#ifdef DCT_IFAST_SUPPORTED
      case JDCT_IFAST:
	fdct->do_dct[ci] = jpeg_fdct_ifast;
	method = JDCT_IFAST;
	break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
      case JDCT_FLOAT:
	fdct->do_float_dct[ci] = jpeg_fdct_float;
	method = JDCT_FLOAT;
	break;
#endif
      default:
	ERREXIT(cinfo, JERR_NOT_COMPILED);
	break;
      }
      break;
    default:
      ERREXIT2(cinfo, JERR_BAD_DCTSIZE,
	       compptr->DCT_h_scaled_size, compptr->DCT_v_scaled_size);
      break;
    }
    qtblno = compptr->quant_tbl_no;
    /* Make sure specified quantization table is present */
    if (qtblno < 0 || qtblno >= NUM_QUANT_TBLS ||
	cinfo->quant_tbl_ptrs[qtblno] == NULL)
      ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, qtblno);
    qtbl = cinfo->quant_tbl_ptrs[qtblno];
    /* Compute divisors for this quant table */
    /* We may do this more than once for same table, but it's not a big deal */
    switch (method) {
#ifdef PROVIDE_ISLOW_TABLES
    case JDCT_ISLOW:
      /* For LL&M IDCT method, divisors are equal to raw quantization
       * coefficients multiplied by 8 (to counteract scaling).
       */
      if (fdct->divisors[qtblno] == NULL) {
	fdct->divisors[qtblno] = (DCTELEM *)
	  (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				      DCTSIZE2 * SIZEOF(DCTELEM));
      }
      dtbl = fdct->divisors[qtblno];
      for (i = 0; i < DCTSIZE2; i++) {
	dtbl[i] = ((DCTELEM) qtbl->quantval[i]) << 3;
      }
      fdct->pub.forward_DCT[ci] = forward_DCT;
      break;
#endif
#ifdef DCT_IFAST_SUPPORTED
    case JDCT_IFAST:
      {
	/* For AA&N IDCT method, divisors are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 8.
	 */
#define CONST_BITS 14
	static const INT16 aanscales[DCTSIZE2] = {
	  /* precomputed values scaled up by 14 bits */
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  22725, 31521, 29692, 26722, 22725, 17855, 12299,  6270,
	  21407, 29692, 27969, 25172, 21407, 16819, 11585,  5906,
	  19266, 26722, 25172, 22654, 19266, 15137, 10426,  5315,
	  16384, 22725, 21407, 19266, 16384, 12873,  8867,  4520,
	  12873, 17855, 16819, 15137, 12873, 10114,  6967,  3552,
	   8867, 12299, 11585, 10426,  8867,  6967,  4799,  2446,
	   4520,  6270,  5906,  5315,  4520,  3552,  2446,  1247
	};
	SHIFT_TEMPS

	if (fdct->divisors[qtblno] == NULL) {
	  fdct->divisors[qtblno] = (DCTELEM *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					DCTSIZE2 * SIZEOF(DCTELEM));
	}
	dtbl = fdct->divisors[qtblno];
	for (i = 0; i < DCTSIZE2; i++) {
	  dtbl[i] = (DCTELEM)
	    DESCALE(MULTIPLY16V16((INT32) qtbl->quantval[i],
				  (INT32) aanscales[i]),
		    CONST_BITS-3);
	}
      }
      fdct->pub.forward_DCT[ci] = forward_DCT;
      break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
    case JDCT_FLOAT:
      {
	/* For float AA&N IDCT method, divisors are equal to quantization
	 * coefficients scaled by scalefactor[row]*scalefactor[col], where
	 *   scalefactor[0] = 1
	 *   scalefactor[k] = cos(k*PI/16) * sqrt(2)    for k=1..7
	 * We apply a further scale factor of 8.
	 * What's actually stored is 1/divisor so that the inner loop can
	 * use a multiplication rather than a division.
	 */
	FAST_FLOAT * fdtbl;
	int row, col;
	static const double aanscalefactor[DCTSIZE] = {
	  1.0, 1.387039845, 1.306562965, 1.175875602,
	  1.0, 0.785694958, 0.541196100, 0.275899379
	};

	if (fdct->float_divisors[qtblno] == NULL) {
	  fdct->float_divisors[qtblno] = (FAST_FLOAT *)
	    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
					DCTSIZE2 * SIZEOF(FAST_FLOAT));
	}
	fdtbl = fdct->float_divisors[qtblno];
	i = 0;
	for (row = 0; row < DCTSIZE; row++) {
	  for (col = 0; col < DCTSIZE; col++) {
	    fdtbl[i] = (FAST_FLOAT)
	      (1.0 / (((double) qtbl->quantval[i] *
		       aanscalefactor[row] * aanscalefactor[col] * 8.0)));
	    i++;
	  }
	}
      }
      fdct->pub.forward_DCT[ci] = forward_DCT_float;
      break;
#endif
    default:
      ERREXIT(cinfo, JERR_NOT_COMPILED);
      break;
    }
  }
}